

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsGetOwnPropertyDescriptorCommon
          (ScriptContext *scriptContext,JsValueRef object,PropertyRecord *propertyRecord,
          JsValueRef *propertyDescriptor)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  BOOL BVar3;
  ThreadContext *this;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  Var pvVar6;
  JavascriptLibrary *this_00;
  undefined1 local_58 [8];
  PropertyDescriptor propertyDescriptorValue;
  JsValueRef *propertyDescriptor_local;
  PropertyRecord *propertyRecord_local;
  JsValueRef object_local;
  ScriptContext *scriptContext_local;
  
  propertyDescriptorValue._40_8_ = propertyDescriptor;
  this = Js::ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::IsScriptActive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x641,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_58);
  pRVar5 = Js::VarTo<Js::RecyclableObject>(object);
  propertyId = Js::PropertyRecord::GetPropertyId(propertyRecord);
  BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                    (pRVar5,propertyId,scriptContext,(PropertyDescriptor *)local_58);
  if (BVar3 == 0) {
    this_00 = Js::ScriptContext::GetLibrary(scriptContext);
    pRVar5 = Js::JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    *(RecyclableObject **)propertyDescriptorValue._40_8_ = pRVar5;
  }
  else {
    pvVar6 = Js::JavascriptOperators::FromPropertyDescriptor
                       ((PropertyDescriptor *)local_58,scriptContext);
    *(Var *)propertyDescriptorValue._40_8_ = pvVar6;
  }
  if (*(long *)propertyDescriptorValue._40_8_ != 0) {
    BVar3 = Js::CrossSite::NeedMarshalVar(*(Var *)propertyDescriptorValue._40_8_,scriptContext);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x64d,
                         "(*propertyDescriptor == nullptr || !Js::CrossSite::NeedMarshalVar(*propertyDescriptor, scriptContext))"
                         ,
                         "*propertyDescriptor == nullptr || !Js::CrossSite::NeedMarshalVar(*propertyDescriptor, scriptContext)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return JsNoError;
}

Assistant:

static JsErrorCode JsGetOwnPropertyDescriptorCommon(Js::ScriptContext * scriptContext,
    _In_ JsValueRef object, _In_ const Js::PropertyRecord * propertyRecord, _Out_ JsValueRef *propertyDescriptor)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    Js::PropertyDescriptor propertyDescriptorValue;
    if (Js::JavascriptOperators::GetOwnPropertyDescriptor(Js::VarTo<Js::RecyclableObject>(object),
        propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptorValue))
    {
        *propertyDescriptor = Js::JavascriptOperators::FromPropertyDescriptor(propertyDescriptorValue, scriptContext);
    }
    else
    {
        *propertyDescriptor = scriptContext->GetLibrary()->GetUndefined();
    }
    Assert(*propertyDescriptor == nullptr || !Js::CrossSite::NeedMarshalVar(*propertyDescriptor, scriptContext));

    return JsNoError;
}